

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base64.cpp
# Opt level: O2

bool __thiscall ON_Base64EncodeStream::Begin(ON_Base64EncodeStream *this)

{
  void *__s;
  
  if (this->m_implementation != (void *)0x0) {
    onfree(this->m_implementation);
    this->m_implementation = (void *)0x0;
  }
  this->m_in_size = 0;
  this->m_out_size = 0;
  this->m_in_crc = 0;
  this->m_out_crc = 0;
  __s = onmalloc(0x94);
  memset(__s,0,0x94);
  this->m_implementation = __s;
  return true;
}

Assistant:

bool ON_Base64EncodeStream::Begin()
{
  if ( 0 != m_implementation )
  {
    onfree(m_implementation);
    m_implementation = 0;
  }

  // zero these because the same instance of an 
  // ON_UncompressStream class may be used multiple times.
  m_in_size = 0;
  m_out_size = 0;
  m_in_crc = 0;
  m_out_crc = 0;

  ON_Base64EncodeImplementation* imp = (ON_Base64EncodeImplementation*)onmalloc(sizeof(*imp));
  memset(imp,0,sizeof(*imp));
  m_implementation = imp;

  return true;
}